

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ostream_logger.cpp
# Opt level: O3

Logger * __thiscall util::logging::Ostream_logger::do_output(Ostream_logger *this,Msg *msg)

{
  uint_least32_t uVar1;
  sp_counted_base *psVar2;
  element_type *peVar3;
  char cVar4;
  undefined8 uVar5;
  M_Level MVar6;
  uint_least32_t uVar7;
  char *__function;
  bool bVar8;
  undefined1 *local_58;
  string fmtmsg;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> tout;
  
  MVar6 = Msg::getMsg_lvl(msg);
  if ((((MVar6 & (this->super_Logger).verb_lvl) == 0) ||
      (psVar2 = (this->outstream).pn.pi_, psVar2 == (sp_counted_base *)0x0)) ||
     (psVar2->use_count_ == 0)) {
    return &this->super_Logger;
  }
  fmtmsg.field_2._8_8_ = 0;
  tout.px = (element_type *)(this->outstream).pn.pi_;
  if ((sp_counted_base *)tout.px != (sp_counted_base *)0x0) {
    uVar7 = ((sp_counted_base *)tout.px)->use_count_;
    do {
      if (uVar7 == 0) {
        tout.px = (element_type *)0x0;
        goto LAB_00115f5c;
      }
      LOCK();
      uVar1 = ((sp_counted_base *)tout.px)->use_count_;
      bVar8 = uVar7 == uVar1;
      if (bVar8) {
        ((sp_counted_base *)tout.px)->use_count_ = uVar7 + 1;
        uVar1 = uVar7;
      }
      uVar7 = uVar1;
      UNLOCK();
    } while (!bVar8);
    fmtmsg.field_2._8_8_ = (this->outstream).px;
  }
LAB_00115f5c:
  uVar5 = fmtmsg.field_2._8_8_;
  peVar3 = (this->super_Logger).formatter.px;
  if (peVar3 == (element_type *)0x0) {
    __function = 
    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<util::logging::Formatter>::operator->() const [T = util::logging::Formatter]"
    ;
  }
  else {
    (*peVar3->_vptr_Formatter[2])(&local_58,peVar3,msg);
    if (uVar5 != 0) {
      std::ostream::write((char *)uVar5,(long)local_58);
      if (fmtmsg.field_2._8_8_ != 0) {
        cVar4 = (char)fmtmsg.field_2._8_8_;
        std::ios::widen((char)*(undefined8 *)(*(long *)fmtmsg.field_2._8_8_ + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        if ((size_type *)local_58 != &fmtmsg._M_string_length) {
          operator_delete(local_58);
        }
        boost::detail::shared_count::~shared_count((shared_count *)&tout);
        return &this->super_Logger;
      }
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,
                    "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<std::basic_ostream<char>>::operator*() const [T = std::basic_ostream<char>]"
                   );
    }
    __function = 
    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<std::basic_ostream<char>>::operator->() const [T = std::basic_ostream<char>]"
    ;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,__function);
}

Assistant:

Logger& Ostream_logger::do_output( const Msg& msg )
		{
			if((msg.getMsg_lvl() & verb_lvl) != 0 and (not outstream.expired()))
			{
				shared_ptr<std::ostream> tout = outstream.lock();

				std::string fmtmsg = formatter->do_formatting(msg);
				tout->write(fmtmsg.c_str(), fmtmsg.size());
				std::endl(*tout);
			}

			return *this;

		}